

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O1

void * JlRealloc(void *OriginalBuffer,size_t OriginalSize,size_t NewSize)

{
  void *__dest;
  
  if ((NewSize != 0 && (OriginalSize != 0 && OriginalBuffer != (void *)0x0)) &&
     (__dest = WjTestLib_Calloc(NewSize,1), __dest != (void *)0x0)) {
    if (NewSize < OriginalSize) {
      OriginalSize = NewSize;
    }
    memcpy(__dest,OriginalBuffer,OriginalSize);
    WjTestLib_Free(OriginalBuffer);
    return __dest;
  }
  return (void *)0x0;
}

Assistant:

void*
    JlRealloc
    (
        void*       OriginalBuffer,
        size_t      OriginalSize,
        size_t      NewSize
    )
{
    void* retPtr;

    if(     NULL != OriginalBuffer
        &&  0 != OriginalSize
        &&  0 != NewSize )
    {
        void* newBuffer = JlAlloc( NewSize );
        if( NULL != newBuffer )
        {
            if( NewSize >= OriginalSize )
            {
                memcpy( newBuffer, OriginalBuffer, OriginalSize );
            }
            else
            {
                // Shrunk
                memcpy( newBuffer, OriginalBuffer, NewSize );
            }

            // Deallocate original
            JlFree( OriginalBuffer );
            retPtr = newBuffer;
        }
        else
        {
            // Failed to allocate memory
            retPtr = NULL;
        }
    }
    else
    {
        // Invalid Parameters;
        retPtr = NULL;
    }

    return retPtr;
}